

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O3

HRESULT __thiscall Js::SCAPropBag::QueryInterface(SCAPropBag *this,IID *riid,void **ppv)

{
  GUID GVar1;
  
  if (ppv == (void **)0x0) {
    return -0x7fffbffd;
  }
  GVar1.Data1 = riid->Data1;
  GVar1.Data2 = riid->Data2;
  GVar1.Data3 = riid->Data3;
  GVar1.Data4[0] = riid->Data4[0];
  GVar1.Data4[1] = riid->Data4[1];
  GVar1.Data4[2] = riid->Data4[2];
  GVar1.Data4[3] = riid->Data4[3];
  GVar1.Data4[4] = riid->Data4[4];
  GVar1.Data4[5] = riid->Data4[5];
  GVar1.Data4[6] = riid->Data4[6];
  GVar1.Data4[7] = riid->Data4[7];
  if (IID_IUnknown != GVar1) {
    *ppv = (void *)0x0;
    return -0x7fffbffe;
  }
  *ppv = this;
  AddRef(this);
  return 0;
}

Assistant:

STDMETHODIMP SCAPropBag::QueryInterface(REFIID riid, void** ppv)
    {
        if (ppv == nullptr)
        {
            return E_POINTER;
        }

        if (IsEqualGUID(riid, IID_IUnknown))
        {
            *ppv = static_cast<IUnknown*>(this);
            AddRef();
            return S_OK;
        }

        *ppv = nullptr;
        return E_NOINTERFACE;
    }